

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O0

void __thiscall
libtorrent::i2p_connection::
do_name_lookup<libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__0>
          (i2p_connection *this,string *name,
          anon_class_16_1_89917c4a_for_m_underlying_handler *handler)

{
  element_type *peVar1;
  char *name_00;
  anon_class_16_1_89917c4a_for_m_underlying_handler *in_RCX;
  undefined1 local_70 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  shared_ptr<libtorrent::i2p_stream> local_58;
  wrap_allocator_t<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_include_libtorrent_i2p_stream_hpp:558:4),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_torrent_cpp:3614:9)>
  local_48;
  anon_class_16_1_89917c4a_for_m_underlying_handler *local_20;
  anon_class_16_1_89917c4a_for_m_underlying_handler *handler_local;
  string *name_local;
  i2p_connection *this_local;
  
  this->m_state = sam_name_lookup;
  local_20 = handler;
  handler_local = (anon_class_16_1_89917c4a_for_m_underlying_handler *)name;
  name_local = (string *)this;
  peVar1 = ::std::
           __shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  name_00 = (char *)::std::__cxx11::string::c_str();
  i2p_stream::set_name_lookup(peVar1,name_00);
  peVar1 = ::std::
           __shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  ::std::shared_ptr<libtorrent::i2p_stream>::shared_ptr(&local_58,&this->m_sam_socket);
  libtorrent::aux::torrent::
  tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)
  ::$_0::__0((__0 *)local_70,handler);
  libtorrent::aux::
  wrap_allocator<libtorrent::i2p_connection::do_name_lookup<libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__0>(std::__cxx11::string_const&,libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__0)::_lambda(boost::system::error_code_const&,libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__0)_1_,libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__0>
            (&local_48,(aux *)&local_60,(anon_class_24_2_fd512de0_for_m_handler *)local_70,in_RCX);
  i2p_stream::
  send_name_lookup<libtorrent::aux::wrap_allocator_t<libtorrent::i2p_connection::do_name_lookup<libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__0>(std::__cxx11::string_const&,libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__0)::_lambda(boost::system::error_code_const&,libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__0)_1_,libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::__0>>
            (peVar1,&local_48);
  libtorrent::aux::
  wrap_allocator_t<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/include/libtorrent/i2p_stream.hpp:558:4),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/torrent.cpp:3614:9)>
  ::~wrap_allocator_t(&local_48);
  libtorrent::aux::torrent::
  tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)
  ::$_0::~__0((__0 *)local_70);
  do_name_lookup<libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::$_0>(std::__cxx11::string_const&,libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::$_0)
  ::
  {lambda(boost::system::error_code_const&,libtorrent::aux::torrent::tracker_response(libtorrent::aux::tracker_request_const&,boost::asio::ip::address_const&,std::__cxx11::list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const&,libtorrent::aux::tracker_response_const&)::$_0)#1}
  ::~error_code((_lambda_boost__system__error_code_const__libtorrent__aux__torrent__tracker_response_libtorrent__aux__tracker_request_const__boost__asio__ip__address_const__std____cxx11__list<boost::asio::ip::address,std::allocator<boost::asio::ip::address>>const__libtorrent__aux__tracker_response_const______0__1_
                 *)&local_60);
  return;
}

Assistant:

void do_name_lookup(std::string const& name, Handler handler)
	{
		TORRENT_ASSERT(m_state == sam_idle);
		m_state = sam_name_lookup;
		m_sam_socket->set_name_lookup(name.c_str());
		m_sam_socket->send_name_lookup(aux::wrap_allocator(
			[this,s=m_sam_socket](error_code const& ec, Handler hn) {
				on_name_lookup(ec, s, std::move(hn));
			}, std::move(handler)));
	}